

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_17UL> *param_5)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 local_68;
  undefined8 uStack_60;
  char *local_58;
  undefined8 local_50;
  long local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  CappedArray<char,_17UL> local_30;
  
  local_68 = *param_2;
  uStack_60 = param_2[1];
  local_58 = ", ";
  local_50 = 3;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = (undefined8 *)0x0;
  Stringifier::operator*(&local_30,(Stringifier *)&STR,(void *)param_2[2]);
  concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char>>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            (__return_storage_ptr__,(_ *)&local_68,
             (Delimited<kj::ArrayPtr<unsigned_char>_> *)(param_2 + 3),(StringPtr *)&local_30,param_5
            );
  uVar2 = uStack_40;
  lVar1 = local_48;
  if (local_48 != 0) {
    local_48 = 0;
    uStack_40 = 0;
    (**(code **)*local_38)(local_38,lVar1,0x10,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}